

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getRelativeJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex refFrameIndex,FrameIndex frameIndex,
          MatrixView<double> *outJacobian)

{
  MatrixStorageOrdering MVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  char *pcVar13;
  double *pdVar14;
  ulong uVar15;
  char *pcVar16;
  pointer peVar17;
  pointer peVar18;
  long lVar19;
  index_type iVar20;
  long lVar21;
  Index i;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong uVar30;
  int iVar31;
  SpatialMotionVector column;
  type tmp;
  Matrix6x6 genericAdjointTransform;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_1a0 [3];
  element_type aeStack_188 [7];
  double local_150 [36];
  
  if ((outJacobian->m_rows == 6) &&
     (lVar8 = outJacobian->m_cols, lVar7 = iDynTree::Model::getNrOfDOFs(), lVar8 == lVar7)) {
    cVar4 = iDynTree::Model::isValidFrameIndex((long)&this->pimpl->m_robot_model);
    if (cVar4 == '\0') {
      pcVar16 = "getRelativeJacobian";
      pcVar13 = "Frame index out of bounds";
    }
    else {
      cVar4 = iDynTree::Model::isValidFrameIndex((long)&this->pimpl->m_robot_model);
      auVar3 = _DAT_00116010;
      auVar2 = _DAT_00116000;
      if (cVar4 != '\0') {
        bVar26 = outJacobian->m_storageOrder == ColumnMajor;
        lVar8 = outJacobian->m_rows;
        lVar7 = 1;
        if (bVar26) {
          lVar7 = lVar8;
        }
        lVar25 = outJacobian->m_cols;
        lVar10 = 1;
        if (!bVar26) {
          lVar10 = lVar25;
        }
        if (0 < lVar8) {
          peVar17 = outJacobian->m_storage;
          lVar22 = lVar25 + -1;
          auVar27._8_4_ = (int)lVar22;
          auVar27._0_8_ = lVar22;
          auVar27._12_4_ = (int)((ulong)lVar22 >> 0x20);
          lVar22 = 0;
          auVar27 = auVar27 ^ _DAT_00116010;
          do {
            uVar24 = lVar25 + 1U & 0xfffffffffffffffe;
            peVar18 = peVar17;
            auVar28 = auVar2;
            if (0 < lVar25) {
              do {
                bVar26 = auVar27._0_4_ < SUB164(auVar28 ^ auVar3,0);
                iVar5 = auVar27._4_4_;
                iVar31 = SUB164(auVar28 ^ auVar3,4);
                if ((bool)(~(iVar5 < iVar31 || iVar31 == iVar5 && bVar26) & 1)) {
                  *peVar18 = 0.0;
                }
                if (iVar5 >= iVar31 && (iVar31 != iVar5 || !bVar26)) {
                  peVar18[lVar7] = 0.0;
                }
                auVar29._0_8_ = auVar28._0_8_ + 2;
                auVar29._8_8_ = auVar28._8_8_ + 2;
                uVar24 = uVar24 - 2;
                peVar18 = peVar18 + lVar7 * 2;
                auVar28 = auVar29;
              } while (uVar24 != 0);
            }
            lVar22 = lVar22 + 1;
            peVar17 = peVar17 + lVar10;
          } while (lVar22 != lVar8);
        }
        lVar8 = iDynTree::Model::getFrameLink((long)&this->pimpl->m_robot_model);
        iDynTree::Model::getFrameLink((long)&this->pimpl->m_robot_model);
        lVar7 = iDynTree::LinkTraversalsCache::getTraversalWithLinkAsBase
                          ((Model *)&this->pimpl->m_traversalCache,(long)&this->pimpl->m_robot_model
                          );
        lVar25 = 0;
        memset(local_150,0,0x120);
        do {
          *(undefined8 *)((long)local_150 + lVar25) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar25 + 8) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar25 + 0x10) = 0x3ff0000000000000;
          lVar25 = lVar25 + 0x30;
        } while (lVar25 != 0x90);
        lVar25 = 0;
        do {
          *(undefined8 *)((long)local_150 + lVar25 + 0x18) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar25 + 0x20) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar25 + 0x28) = 0x3ff0000000000000;
          lVar25 = lVar25 + 0x30;
        } while (lVar25 != 0x90);
        lVar25 = 0xa8;
        do {
          *(undefined8 *)((long)local_150 + lVar25) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar25 + 8) = 0x3ff0000000000000;
          *(undefined8 *)((long)local_150 + lVar25 + 0x10) = 0x3ff0000000000000;
          lVar25 = lVar25 + 0x30;
        } while (lVar25 != 0x138);
        iDynTree::Traversal::getBaseLink();
        lVar25 = iDynTree::Link::getIndex();
        if (lVar8 != lVar25) {
          do {
            iDynTree::Traversal::getParentLinkFromLinkIndex(lVar7);
            lVar25 = iDynTree::Link::getIndex();
            plVar9 = (long *)iDynTree::Traversal::getParentJointFromLinkIndex(lVar7);
            lVar10 = (**(code **)(*plVar9 + 0xc0))(plVar9);
            iVar5 = (**(code **)(*plVar9 + 0x20))(plVar9);
            if (iVar5 != 0) {
              lVar22 = lVar10 * 8;
              uVar24 = 0;
              do {
                pdVar14 = &local_1b8;
                (**(code **)(*plVar9 + 0x60))(pdVar14,plVar9,uVar24 & 0xffffffff,lVar8,lVar25);
                uVar11 = 0;
                uVar30 = (ulong)DAT_00116040;
                do {
                  pdVar12 = local_1a0 + ((int)uVar11 - 3);
                  if (uVar11 < 3) {
                    pdVar12 = pdVar14;
                  }
                  *pdVar12 = (double)(~-(ulong)((double)((ulong)*pdVar12 & uVar30) < DEFAULT_TOL) &
                                     0x3ff0000000000000);
                  uVar11 = uVar11 + 1;
                  pdVar14 = pdVar14 + 1;
                } while (uVar11 != 6);
                MVar1 = outJacobian->m_storageOrder;
                peVar17 = outJacobian->m_storage;
                lVar19 = outJacobian->m_rows;
                lVar21 = 1;
                if (MVar1 == ColumnMajor) {
                  lVar21 = lVar19;
                }
                iVar20 = outJacobian->m_cols;
                pdVar14 = local_150 + 4;
                lVar23 = 0;
                do {
                  local_1a0[lVar23 + 3] =
                       pdVar14[1] * local_1a0[2] + pdVar14[-1] * local_1a0[0] +
                       pdVar14[-3] * dStack_1b0 +
                       *pdVar14 * local_1a0[1] + pdVar14[-2] * local_1a8 + pdVar14[-4] * local_1b8;
                  lVar23 = lVar23 + 1;
                  pdVar14 = pdVar14 + 6;
                } while (lVar23 != 6);
                if (MVar1 == ColumnMajor) {
                  iVar20 = 1;
                }
                if (0 < lVar19) {
                  peVar18 = (pointer)(lVar21 * lVar22 + (long)peVar17);
                  lVar21 = 0;
                  do {
                    *peVar18 = local_1a0[lVar21 + 3];
                    lVar21 = lVar21 + 1;
                    peVar18 = peVar18 + iVar20;
                  } while (lVar19 != lVar21);
                }
                uVar11 = outJacobian->m_rows;
                if (uVar11 != 0) {
                  uVar15 = 0;
                  do {
                    iVar20 = 1;
                    if (MVar1 != ColumnMajor) {
                      iVar20 = outJacobian->m_cols;
                      uVar11 = 1;
                    }
                    lVar19 = uVar11 * (lVar10 + uVar24);
                    peVar17[lVar19 + iVar20 * uVar15] =
                         (element_type)
                         (~-(ulong)((double)((ulong)peVar17[lVar19 + iVar20 * uVar15] & uVar30) <
                                   DEFAULT_TOL) & 0x3ff0000000000000);
                    uVar15 = uVar15 + 1;
                    uVar11 = outJacobian->m_rows;
                  } while (uVar15 < uVar11);
                }
                uVar24 = uVar24 + 1;
                uVar6 = (**(code **)(*plVar9 + 0x20))(plVar9);
                lVar22 = lVar22 + 8;
              } while (uVar24 < uVar6);
            }
            iDynTree::Traversal::getBaseLink();
            lVar10 = iDynTree::Link::getIndex();
            lVar8 = lVar25;
          } while (lVar25 != lVar10);
        }
        return true;
      }
      pcVar16 = "getRelativeJacobian";
      pcVar13 = "Reference frame index out of bounds";
    }
  }
  else {
    pcVar16 = "getRelativeJacobianSparsityPattern";
    pcVar13 = "Wrong size in input outJacobian";
  }
  iDynTree::reportError("KinDynComputations",pcVar16,pcVar13);
  return false;
}

Assistant:

bool KinDynComputations::getRelativeJacobianSparsityPattern(const iDynTree::FrameIndex refFrameIndex,
                                                            const iDynTree::FrameIndex frameIndex,
                                                            MatrixView<double> outJacobian) const
    {
        bool ok = (outJacobian.rows() == 6)
            && (outJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs());

        if( !ok )
        {
            reportError("KinDynComputations","getRelativeJacobianSparsityPattern","Wrong size in input outJacobian");
            return false;
        }

        if (!pimpl->m_robot_model.isValidFrameIndex(frameIndex))
        {
            reportError("KinDynComputations","getRelativeJacobian","Frame index out of bounds");
            return false;
        }
        if (!pimpl->m_robot_model.isValidFrameIndex(refFrameIndex))
        {
            reportError("KinDynComputations","getRelativeJacobian","Reference frame index out of bounds");
            return false;
        }

        // clear the matrix
        toEigen(outJacobian).setZero();

        // This method computes the sparsity pattern of the relative Jacobian.
        // For details on how to compute the relative Jacobian, see Traversaro's PhD thesis, 3.37
        // or getRelativeJacobianExplicit method.
        // Here we simply implement the same code, but trying to obtain only 1 and zeros.

        // Get the links to which the frames are attached
        LinkIndex jacobianLinkIndex = pimpl->m_robot_model.getFrameLink(frameIndex);
        LinkIndex refJacobianLink = pimpl->m_robot_model.getFrameLink(refFrameIndex);

        iDynTree::Traversal& relativeTraversal = pimpl->m_traversalCache.getTraversalWithLinkAsBase(pimpl->m_robot_model, refJacobianLink);

        // Compute joint part
        // We iterate from the link up in the traveral until we reach the base
        LinkIndex visitedLinkIdx = jacobianLinkIndex;

        // Generic adjoint transform matrix (6x6).
        // Rotations are filled with 1.
        Matrix6x6 genericAdjointTransform;
        genericAdjointTransform.zero();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).topLeftCorner(3, 3).setOnes();
        // Set 1 to p \times R (top right)
        iDynTree::toEigen(genericAdjointTransform).topRightCorner(3, 3).setOnes();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).bottomRightCorner(3, 3).setOnes();


        while (visitedLinkIdx != relativeTraversal.getBaseLink()->getIndex())
        {
            //get the pair of links in the traversal
            LinkIndex parentLinkIdx = relativeTraversal.getParentLinkFromLinkIndex(visitedLinkIdx)->getIndex();
            IJointConstPtr joint = relativeTraversal.getParentJointFromLinkIndex(visitedLinkIdx);

            //Now for each Dof get the motion subspace
            //{}^F s_{E,F}, i.e. the velocity of F wrt E written in F.
            size_t dofOffset = joint->getDOFsOffset();
            for (int i = 0; i < joint->getNrOfDOFs(); ++i)
            {
                // This is actually where we specify the pattern
                SpatialMotionVector column = joint->getMotionSubspaceVector(i, visitedLinkIdx, parentLinkIdx);
                for (size_t c = 0; c < column.size(); ++c) {
                    column(c) = std::abs(column(c)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
                toEigen(outJacobian).col(dofOffset + i) = toEigen(genericAdjointTransform) * toEigen(column);
                //have only 0 and 1 => divide component wise the column by itself
                for (size_t r = 0; r < toEigen(outJacobian).col(dofOffset + i).size(); ++r) {
                    toEigen(outJacobian).col(dofOffset + i).coeffRef(r) = std::abs(toEigen(outJacobian).col(dofOffset + i).coeffRef(r)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }

            }

            visitedLinkIdx = parentLinkIdx;
        }
        return true;
    }